

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.cpp
# Opt level: O3

bool __thiscall
Sonne::Counter::_CompareStringToBuffer
          (Counter *this,vector<char,_std::allocator<char>_> *buffer,string *compare,size_t *start)

{
  size_t sVar1;
  pointer pcVar2;
  char *pcVar3;
  char cVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  sVar1 = *start;
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar3 = (compare->_M_dataplus)._M_p;
  if (pcVar2[sVar1] == *pcVar3) {
    bVar6 = true;
    if (1 < compare->_M_string_length) {
      lVar5 = 0;
      do {
        if (sVar1 + 1 + lVar5 <
            (ulong)((long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pcVar2)) {
          cVar4 = pcVar2[lVar5 + sVar1 + 1];
        }
        else {
          cVar4 = '\0';
        }
        bVar6 = cVar4 == pcVar3[lVar5 + 1];
      } while ((bVar6) && (bVar7 = compare->_M_string_length - 2 != lVar5, lVar5 = lVar5 + 1, bVar7)
              );
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool Counter::_CompareStringToBuffer(std::vector<char>& buffer, std::string& compare, const size_t& start)
{
    // check if the first character matches, and if not we can already say that the string doesn't match
    if (buffer[start] != compare[0])
    {
        return false;
    }

    for (size_t i = 1; i < compare.size(); i++)
    {
        char& compareChar = compare.at(i);

        if (_GetBufferLookahead(buffer, start + i) != compareChar)
        {
            return false; // the current character is not the same of that in the buffer, so no match
        }
    }

    return true;
}